

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcodecompile.cc
# Opt level: O0

void __thiscall PcodeCompile::newLocalDefinition(PcodeCompile *this,string *varname,uint4 size)

{
  string *nm;
  string *psVar1;
  VarnodeTpl *pVVar2;
  ConstTpl *pCVar3;
  AddrSpace *base;
  uintb offset;
  uintb uVar4;
  ConstTpl local_50;
  VarnodeTpl *local_30;
  VarnodeTpl *tmpvn;
  VarnodeSymbol *sym;
  string *psStack_18;
  uint4 size_local;
  string *varname_local;
  PcodeCompile *this_local;
  
  sym._4_4_ = size;
  psStack_18 = varname;
  varname_local = (string *)this;
  pVVar2 = buildTemporary(this);
  local_30 = pVVar2;
  if (sym._4_4_ != 0) {
    ConstTpl::ConstTpl(&local_50,real,(ulong)sym._4_4_);
    VarnodeTpl::setSize(pVVar2,&local_50);
  }
  pVVar2 = (VarnodeTpl *)operator_new(0x58);
  nm = psStack_18;
  pCVar3 = VarnodeTpl::getSpace(local_30);
  base = ConstTpl::getSpace(pCVar3);
  pCVar3 = VarnodeTpl::getOffset(local_30);
  offset = ConstTpl::getReal(pCVar3);
  pCVar3 = VarnodeTpl::getSize(local_30);
  uVar4 = ConstTpl::getReal(pCVar3);
  VarnodeSymbol::VarnodeSymbol((VarnodeSymbol *)pVVar2,nm,base,offset,(int4)uVar4);
  tmpvn = pVVar2;
  (*this->_vptr_PcodeCompile[1])(this,pVVar2);
  psVar1 = (string *)psStack_18;
  if (psStack_18 != (string *)0x0) {
    std::__cxx11::string::~string((string *)psStack_18);
    operator_delete(psVar1);
  }
  return;
}

Assistant:

void PcodeCompile::newLocalDefinition(string *varname,uint4 size)

{ // Create a new temporary symbol (without generating any pcode)
  VarnodeSymbol *sym;
  VarnodeTpl *tmpvn = buildTemporary();
  if (size != 0)
    tmpvn->setSize(ConstTpl(ConstTpl::real,size)); // Size was explicitly specified
  sym = new VarnodeSymbol(*varname,tmpvn->getSpace().getSpace(),tmpvn->getOffset().getReal(),tmpvn->getSize().getReal());
  addSymbol(sym);
  delete varname;
}